

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

string * string_from_abi_cxx11_
                   (string *__return_storage_ptr__,llama_context *ctx,llama_batch *batch)

{
  byte *pbVar1;
  byte bVar2;
  llama_token token;
  string *psVar3;
  uint uVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  undefined8 uVar8;
  llama_vocab *vocab;
  ostream *poVar9;
  ulong uVar10;
  uint uVar11;
  _Alloc_hider _Var12;
  byte *pbVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  byte *pbVar17;
  uint uVar18;
  _Alloc_hider _Var19;
  string detokenized;
  string __str_4;
  string __str_3;
  string __str_2;
  string __str_1;
  string __str;
  stringstream buf;
  string local_288;
  long *local_268;
  long local_260;
  long local_258 [2];
  long *local_248;
  long local_240;
  long local_238 [2];
  long *local_228;
  long local_220;
  long local_218 [2];
  long *local_208;
  long local_200;
  long local_1f8 [2];
  long *local_1e8;
  long local_1e0;
  long local_1d8 [2];
  string *local_1c8;
  llama_context *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1c8 = __return_storage_ptr__;
  local_1c0 = ctx;
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[ ",2);
  if (0 < batch->n_tokens) {
    bVar5 = true;
    uVar14 = 0;
    do {
      if (!bVar5) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
      }
      token = batch->token[uVar14];
      uVar8 = llama_get_model(local_1c0);
      vocab = (llama_vocab *)llama_model_get_vocab(uVar8);
      common_token_to_piece_abi_cxx11_(&local_288,vocab,token,true);
      _Var19._M_p = local_288._M_dataplus._M_p;
      pbVar1 = (byte *)(local_288._M_dataplus._M_p + local_288._M_string_length);
      _Var12._M_p = local_288._M_dataplus._M_p;
      if (0 < (long)local_288._M_string_length >> 2) {
        _Var12._M_p = local_288._M_dataplus._M_p + (local_288._M_string_length & 0xfffffffffffffffc)
        ;
        lVar16 = ((long)local_288._M_string_length >> 2) + 1;
        pbVar13 = (byte *)(local_288._M_dataplus._M_p + 3);
        do {
          iVar6 = isprint((uint)pbVar13[-3]);
          if (iVar6 == 0) {
            pbVar13 = pbVar13 + -3;
            goto LAB_001f52a8;
          }
          iVar6 = isprint((uint)pbVar13[-2]);
          if (iVar6 == 0) {
            pbVar13 = pbVar13 + -2;
            goto LAB_001f52a8;
          }
          iVar6 = isprint((uint)pbVar13[-1]);
          if (iVar6 == 0) {
            pbVar13 = pbVar13 + -1;
            goto LAB_001f52a8;
          }
          iVar6 = isprint((uint)*pbVar13);
          if (iVar6 == 0) goto LAB_001f52a8;
          lVar16 = lVar16 + -1;
          pbVar13 = pbVar13 + 4;
        } while (1 < lVar16);
      }
      lVar16 = (long)pbVar1 - (long)_Var12._M_p;
      if (lVar16 == 1) {
LAB_001f5285:
        iVar6 = isprint((uint)(byte)*_Var12._M_p);
        pbVar13 = (byte *)_Var12._M_p;
        if (iVar6 != 0) {
          pbVar13 = pbVar1;
        }
LAB_001f52a8:
        pbVar17 = pbVar13 + 1;
        if (pbVar17 != pbVar1 && pbVar13 != pbVar1) {
          do {
            bVar2 = *pbVar17;
            iVar6 = isprint((uint)bVar2);
            if (iVar6 != 0) {
              *pbVar13 = bVar2;
              pbVar13 = pbVar13 + 1;
            }
            pbVar17 = pbVar17 + 1;
            _Var19._M_p = local_288._M_dataplus._M_p;
          } while (pbVar17 != pbVar1);
        }
      }
      else {
        if (lVar16 == 2) {
LAB_001f5275:
          iVar6 = isprint((uint)(byte)*_Var12._M_p);
          pbVar13 = (byte *)_Var12._M_p;
          if (iVar6 != 0) {
            _Var12._M_p = _Var12._M_p + 1;
            goto LAB_001f5285;
          }
          goto LAB_001f52a8;
        }
        pbVar13 = pbVar1;
        if (lVar16 == 3) {
          iVar6 = isprint((uint)(byte)*_Var12._M_p);
          pbVar13 = (byte *)_Var12._M_p;
          if (iVar6 != 0) {
            _Var12._M_p = _Var12._M_p + 1;
            goto LAB_001f5275;
          }
          goto LAB_001f52a8;
        }
      }
      local_288._M_string_length = (long)pbVar13 - (long)_Var19._M_p;
      *pbVar13 = 0;
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
      uVar11 = 1;
      if (9 < uVar14) {
        uVar15 = 4;
        uVar10 = uVar14;
        do {
          uVar11 = uVar15;
          uVar18 = (uint)uVar10;
          if (uVar18 < 100) {
            uVar11 = uVar11 - 2;
            goto LAB_001f535c;
          }
          if (uVar18 < 1000) {
            uVar11 = uVar11 - 1;
            goto LAB_001f535c;
          }
          if (uVar18 < 10000) goto LAB_001f535c;
          uVar10 = (uVar10 & 0xffffffff) / 10000;
          uVar15 = uVar11 + 4;
        } while (99999 < uVar18);
        uVar11 = uVar11 + 1;
      }
LAB_001f535c:
      local_1e8 = local_1d8;
      std::__cxx11::string::_M_construct((ulong)&local_1e8,(char)uVar11);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1e8,uVar11,(uint)uVar14);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(char *)local_1e8,local_1e0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", token \'",9);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,local_288._M_dataplus._M_p,local_288._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\'",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", pos ",6);
      uVar11 = batch->pos[uVar14];
      uVar15 = -uVar11;
      if (0 < (int)uVar11) {
        uVar15 = uVar11;
      }
      uVar18 = 1;
      if (9 < uVar15) {
        uVar10 = (ulong)uVar15;
        uVar4 = 4;
        do {
          uVar18 = uVar4;
          uVar7 = (uint)uVar10;
          if (uVar7 < 100) {
            uVar18 = uVar18 - 2;
            goto LAB_001f5468;
          }
          if (uVar7 < 1000) {
            uVar18 = uVar18 - 1;
            goto LAB_001f5468;
          }
          if (uVar7 < 10000) goto LAB_001f5468;
          uVar10 = uVar10 / 10000;
          uVar4 = uVar18 + 4;
        } while (99999 < uVar7);
        uVar18 = uVar18 + 1;
      }
LAB_001f5468:
      local_208 = local_1f8;
      std::__cxx11::string::_M_construct
                ((ulong)&local_208,(char)uVar18 - (char)((int)uVar11 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((long)local_208 + (ulong)(uVar11 >> 0x1f)),uVar18,uVar15);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,(char *)local_208,local_200);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", n_seq_id ",0xb);
      uVar11 = batch->n_seq_id[uVar14];
      uVar15 = -uVar11;
      if (0 < (int)uVar11) {
        uVar15 = uVar11;
      }
      uVar18 = 1;
      if (9 < uVar15) {
        uVar10 = (ulong)uVar15;
        uVar4 = 4;
        do {
          uVar18 = uVar4;
          uVar7 = (uint)uVar10;
          if (uVar7 < 100) {
            uVar18 = uVar18 - 2;
            goto LAB_001f553b;
          }
          if (uVar7 < 1000) {
            uVar18 = uVar18 - 1;
            goto LAB_001f553b;
          }
          if (uVar7 < 10000) goto LAB_001f553b;
          uVar10 = uVar10 / 10000;
          uVar4 = uVar18 + 4;
        } while (99999 < uVar7);
        uVar18 = uVar18 + 1;
      }
LAB_001f553b:
      local_228 = local_218;
      std::__cxx11::string::_M_construct
                ((ulong)&local_228,(char)uVar18 - (char)((int)uVar11 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((long)local_228 + (ulong)(uVar11 >> 0x1f)),uVar18,uVar15);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,(char *)local_228,local_220);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", seq_id ",9);
      uVar11 = *batch->seq_id[uVar14];
      uVar15 = -uVar11;
      if (0 < (int)uVar11) {
        uVar15 = uVar11;
      }
      uVar18 = 1;
      if (9 < uVar15) {
        uVar10 = (ulong)uVar15;
        uVar4 = 4;
        do {
          uVar18 = uVar4;
          uVar7 = (uint)uVar10;
          if (uVar7 < 100) {
            uVar18 = uVar18 - 2;
            goto LAB_001f5601;
          }
          if (uVar7 < 1000) {
            uVar18 = uVar18 - 1;
            goto LAB_001f5601;
          }
          if (uVar7 < 10000) goto LAB_001f5601;
          uVar10 = uVar10 / 10000;
          uVar4 = uVar18 + 4;
        } while (99999 < uVar7);
        uVar18 = uVar18 + 1;
      }
LAB_001f5601:
      local_248 = local_238;
      std::__cxx11::string::_M_construct
                ((ulong)&local_248,(char)uVar18 - (char)((int)uVar11 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((long)local_248 + (ulong)(uVar11 >> 0x1f)),uVar18,uVar15);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,(char *)local_248,local_240);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", logits ",9);
      uVar15 = (uint)batch->logits[uVar14];
      uVar11 = -uVar15;
      if (0 < (int)uVar15) {
        uVar11 = uVar15;
      }
      uVar18 = 3 - (uVar11 < 100);
      if (uVar11 < 10) {
        uVar18 = 1;
      }
      local_268 = local_258;
      std::__cxx11::string::_M_construct
                ((ulong)&local_268,(char)uVar18 - (batch->logits[uVar14] >> 7));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((long)local_268 + (ulong)(uVar15 >> 0x1f)),uVar18,uVar11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)local_268,local_260);
      if (local_268 != local_258) {
        operator_delete(local_268,local_258[0] + 1);
      }
      if (local_248 != local_238) {
        operator_delete(local_248,local_238[0] + 1);
      }
      if (local_228 != local_218) {
        operator_delete(local_228,local_218[0] + 1);
      }
      if (local_208 != local_1f8) {
        operator_delete(local_208,local_1f8[0] + 1);
      }
      if (local_1e8 != local_1d8) {
        operator_delete(local_1e8,local_1d8[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
      }
      uVar14 = uVar14 + 1;
      bVar5 = false;
    } while ((long)uVar14 < (long)batch->n_tokens);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ]",2);
  psVar3 = local_1c8;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar3;
}

Assistant:

std::string string_from(const struct llama_context * ctx, const struct llama_batch & batch) {
    std::stringstream buf;

    buf << "[ ";

    bool first = true;
    for (int i = 0; i < batch.n_tokens; ++i) {
        if (!first) {
            buf << ", ";
        } else {
            first = false;
        }

        auto detokenized = common_token_to_piece(ctx, batch.token[i]);

        detokenized.erase(
                std::remove_if(
                    detokenized.begin(),
                    detokenized.end(),
                    [](const unsigned char c) { return !std::isprint(c); }),
                detokenized.end());

        buf << "\n"          << std::to_string(i)
            << ", token '"   << detokenized << "'"
            << ", pos "      << std::to_string(batch.pos[i])
            << ", n_seq_id " << std::to_string(batch.n_seq_id[i])
            << ", seq_id "   << std::to_string(batch.seq_id[i][0])
            << ", logits "   << std::to_string(batch.logits[i]);
    }

    buf << " ]";

    return buf.str();
}